

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  undefined4 uVar2;
  uint uVar3;
  void *pvVar4;
  pointer pUVar5;
  _Hash_node_base *p_Var6;
  _Bit_type _Var7;
  undefined8 uVar8;
  vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
  *pvVar9;
  __buckets_ptr pp_Var10;
  bool bVar11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  __node_base _Var14;
  uint uVar15;
  __hashtable *__h_6;
  size_type sVar16;
  Column_dimension_option CVar17;
  __hashtable *__h_2;
  __hashtable *__h;
  Column_support *pCVar18;
  __buckets_ptr pp_Var19;
  _Bit_type *p_Var20;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  pair<std::__detail::_Node_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true,_true>,_bool>
  pVar21;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> container_5;
  vector<bool,_std::allocator<bool>_> veccont;
  _Hash_node_base local_448;
  vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
  *local_440;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col2;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col4;
  _Hash_node_base local_390;
  char *pcStack_388;
  shared_count sStack_380;
  _Hash_node_base *local_378;
  _Hash_node_base local_370;
  char *local_368;
  shared_count sStack_360;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col3;
  _Hash_node_base local_300;
  char *local_2f8;
  shared_count sStack_2f0;
  char *local_2e8;
  _Hash_node_base local_2e0;
  char *local_2d8;
  _Hash_node_base local_2d0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col1;
  _Hash_node_base local_270;
  undefined1 local_264 [4];
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col0;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._4_4_ = 1;
  col2.column_._M_h._M_buckets = (__buckets_ptr)0x500000002;
  col2.column_._M_h._M_bucket_count._0_4_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)&col2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,__l,
             (allocator_type *)&local_390);
  sVar16 = (long)col1.column_._M_h._M_buckets - col1._0_8_ >> 2;
  col0.super_Column_dimension_option.dim_ = (int)sVar16 + -1;
  if (col1.column_._M_h._M_buckets == (__buckets_ptr)col1._0_8_) {
    col0.super_Column_dimension_option.dim_ = 0;
  }
  local_440 = matrix;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col0.column_._M_h,sVar16,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col3,(key_equal *)&col4,(allocator_type *)&container_5);
  pp_Var10 = col1.column_._M_h._M_buckets;
  col0.operators_ = (Field_operators *)0x0;
  col0.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col1._0_8_ != col1.column_._M_h._M_buckets) {
    pp_Var19 = (__buckets_ptr)col1._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var19;
      col4._0_8_ = operator_new(4);
      *(undefined4 *)col4._0_8_ = uVar2;
      col3._0_8_ = &col0.column_;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)col3._0_8_,&col4,&col3);
      pp_Var19 = (__buckets_ptr)((long)pp_Var19 + 4);
    } while (pp_Var19 != pp_Var10);
  }
  if (col1._0_8_ != 0) {
    operator_delete((void *)col1._0_8_,col1.column_._M_h._M_bucket_count - col1._0_8_);
  }
  if (col0.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pCVar18 = &((local_440->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->column_;
    _Var14._M_nxt = col0.column_._M_h._M_before_begin._M_nxt;
    do {
      uVar2 = *(undefined4 *)&(_Var14._M_nxt[1]._M_nxt)->_M_nxt;
      col2._0_8_ = operator_new(4);
      *(undefined4 *)col2._0_8_ = uVar2;
      col1._0_8_ = pCVar18;
      pVar21 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar18,&col2,&col1);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (col2._0_8_ != 0) {
          operator_delete((void *)col2._0_8_,4);
        }
        pvVar4 = *(void **)((long)pVar21.first.
                                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                  ._M_cur + 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,4);
        }
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar18->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar21.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  col1._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col1);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3bf);
  pvVar9 = local_440;
  pUVar5 = (local_440->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if ((pUVar5->column_)._M_h._M_element_count != 0) {
      p_Var13 = (pUVar5->column_)._M_h._M_before_begin._M_nxt;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        p_Var6 = p_Var13->_M_nxt;
        for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          p_Var12 = p_Var6;
          if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
            p_Var12 = p_Var13;
          }
          p_Var13 = p_Var12;
        }
      }
      uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
      goto LAB_001537ae;
    }
    col1.column_._M_h._M_bucket_count = 0;
    col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 0;
    col1.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
    col1.super_Column_dimension_option.dim_ = 0;
    col1._4_4_ = 0;
    col1.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col1.column_._M_h._M_element_count = 0;
  }
  else {
LAB_001537ae:
    col2._0_8_ = col2._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col1,(long)(int)uVar15,(bool *)&col2,
               (allocator_type *)&col4);
    for (p_Var13 = (pUVar5->column_)._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
        p_Var13 = p_Var13->_M_nxt) {
      uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar15) {
        puVar1 = (ulong *)(col1._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1.super__Bit_iterator_base._M_offset = (uint)col1.column_._M_h._M_before_begin._M_nxt;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)col1.column_._M_h._M_bucket_count;
  if ((ulong)(uint)col1.column_._M_h._M_before_begin._M_nxt +
      (col1.column_._M_h._M_bucket_count - col1._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)col1._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1,__last1,__first2);
  }
  else {
    bVar11 = false;
  }
  col3.super_Column_dimension_option.dim_._0_1_ = bVar11;
  col3.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col4._0_8_ = anon_var_dwarf_62f9a;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x18f69c;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001af7f0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&col4;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_60,0x3bf,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.column_._M_h._M_bucket_count);
  if (col1._0_8_ != 0) {
    operator_delete((void *)col1._0_8_,col1.column_._M_h._M_element_count - col1._0_8_);
    col1.super_Column_dimension_option.dim_ = 0;
    col1._4_4_ = 0;
    col1.column_._M_h._M_buckets =
         (__buckets_ptr)((ulong)col1.column_._M_h._M_buckets & 0xffffffff00000000);
    col1.column_._M_h._M_bucket_count = 0;
    col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 0;
    col1.column_._M_h._M_element_count = 0;
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3c1);
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001af7b0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18b15b;
  col3.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_370._M_nxt =
       (_Hash_node_base *)
       (((pvVar9->
         super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->column_)._M_h._M_element_count;
  local_390._M_nxt = &local_370;
  col4.super_Column_dimension_option.dim_._0_1_ = local_370._M_nxt == (_Hash_node_base *)0x3;
  local_300._M_nxt = &local_2e0;
  local_2e0._M_nxt._0_4_ = 3;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_49eaa;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
       + 0x73;
  col1.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col1.column_._M_h._M_buckets & 0xffffffffffffff00);
  col1._0_8_ = &PTR__lazy_ostream_001af6f8;
  col1.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col1.column_._M_h._M_before_begin._M_nxt = &local_390;
  col2.column_._M_h._M_before_begin._M_nxt = &local_300;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001af770;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  col3.super_Column_dimension_option.dim_ = 0;
  col3._4_4_ = 1;
  col3.column_._M_h._M_buckets = (__buckets_ptr)0x500000002;
  col3.column_._M_h._M_bucket_count._0_4_ = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,__l_00,
             (allocator_type *)&local_300);
  sVar16 = (long)col2.column_._M_h._M_buckets - col2._0_8_ >> 2;
  CVar17.dim_ = 0;
  if (col2.column_._M_h._M_buckets != (__buckets_ptr)col2._0_8_) {
    CVar17.dim_ = (int)sVar16 + -1;
  }
  pCVar18 = &col1.column_;
  col1.super_Column_dimension_option.dim_ = CVar17.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&pCVar18->_M_h,sVar16,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col4,(key_equal *)&container_5,(allocator_type *)&local_390);
  pp_Var10 = col2.column_._M_h._M_buckets;
  col1.operators_ = (Field_operators *)0x0;
  col1.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col2._0_8_ != col2.column_._M_h._M_buckets) {
    pp_Var19 = (__buckets_ptr)col2._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var19;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)operator_new(4);
      *(undefined4 *)
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p = uVar2;
      col4._0_8_ = pCVar18;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pCVar18,&container_5,&col4);
      pp_Var19 = (__buckets_ptr)((long)pp_Var19 + 4);
    } while (pp_Var19 != pp_Var10);
  }
  _Var14._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,
                    CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                             (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_);
    _Var14._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
  }
  pvVar9 = local_440;
  col1.column_._M_h._M_before_begin._M_nxt = _Var14._M_nxt;
  if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
    pCVar18 = &(local_440->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].column_;
    do {
      uVar2 = *(undefined4 *)&(_Var14._M_nxt[1]._M_nxt)->_M_nxt;
      col3._0_8_ = operator_new(4);
      *(undefined4 *)col3._0_8_ = uVar2;
      col2._0_8_ = pCVar18;
      pVar21 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar18,&col3,&col2);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (col3._0_8_ != 0) {
          operator_delete((void *)col3._0_8_,4);
        }
        pvVar4 = *(void **)((long)pVar21.first.
                                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                  ._M_cur + 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,4);
        }
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar18->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar21.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x3c8);
  pUVar5 = (pvVar9->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if (pUVar5[1].column_._M_h._M_element_count != 0) {
      p_Var13 = pUVar5[1].column_._M_h._M_before_begin._M_nxt;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        p_Var6 = p_Var13->_M_nxt;
        for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          p_Var12 = p_Var6;
          if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
            p_Var12 = p_Var13;
          }
          p_Var13 = p_Var12;
        }
      }
      uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
      goto LAB_00153cef;
    }
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.column_._M_h._M_element_count = 0;
  }
  else {
LAB_00153cef:
    col3._0_8_ = col3._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar15,(bool *)&col3,
               (allocator_type *)&container_5);
    for (p_Var13 = pUVar5[1].column_._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
        p_Var13 = p_Var13->_M_nxt) {
      uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar15) {
        puVar1 = (ulong *)(col2._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = col2.column_._M_h._M_bucket_count._4_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col2.column_._M_h._M_bucket_count;
  __last1_00.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)col2._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar11 = false;
  }
  col4.super_Column_dimension_option.dim_._0_1_ = bVar11;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_62fb4;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = (long)"matrix[1].get_content(veccont.size()) == veccont" + 0x30;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001af7f0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&container_5;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_b0,0x3c8,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,col2.column_._M_h._M_element_count - col2._0_8_);
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets =
         (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffff00000000);
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt =
         col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff00000000;
    col2.column_._M_h._M_element_count = 0;
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x3ca);
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001af7b0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18b15b;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_2e0._M_nxt =
       (_Hash_node_base *)
       (pvVar9->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1].column_._M_h._M_element_count;
  local_370._M_nxt = &local_448;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                local_2e0._M_nxt == (_Hash_node_base *)0x0);
  local_448._M_nxt = (_Hash_node_base *)((ulong)local_448._M_nxt._4_4_ << 0x20);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_390._M_nxt = (_Hash_node_base *)0x18b1dd;
  pcStack_388 = "";
  local_300._M_nxt = &local_2e0;
  col2._0_8_ = &PTR__lazy_ostream_001af6f8;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt = &local_300;
  col3._0_8_ = &PTR__lazy_ostream_001af770;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&col4,&local_390,0x3ca,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  col2.super_Column_dimension_option.dim_._0_1_ = 1;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((pvVar9->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&col2,&col1);
  col2._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col2);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x3d0);
  pUVar5 = (pvVar9->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if (pUVar5[4].column_._M_h._M_element_count != 0) {
      p_Var13 = pUVar5[4].column_._M_h._M_before_begin._M_nxt;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        p_Var6 = p_Var13->_M_nxt;
        for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          p_Var12 = p_Var6;
          if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
            p_Var12 = p_Var13;
          }
          p_Var13 = p_Var12;
        }
      }
      uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
      goto LAB_001540c0;
    }
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.column_._M_h._M_element_count = 0;
  }
  else {
LAB_001540c0:
    col3._0_8_ = col3._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar15,(bool *)&col3,
               (allocator_type *)&container_5);
    for (p_Var13 = pUVar5[4].column_._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
        p_Var13 = p_Var13->_M_nxt) {
      uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar15) {
        puVar1 = (ulong *)(col2._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = col2.column_._M_h._M_bucket_count._4_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col2.column_._M_h._M_bucket_count;
  __last1_01.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)col2._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar11 = false;
  }
  col4.super_Column_dimension_option.dim_._0_1_ = bVar11;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_62fce;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = (long)"matrix[4].get_content(veccont.size()) == veccont" + 0x30;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001af7f0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&container_5;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_100,0x3d0,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,col2.column_._M_h._M_element_count - col2._0_8_);
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets =
         (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffff00000000);
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt =
         col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff00000000;
    col2.column_._M_h._M_element_count = 0;
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x3d2);
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001af7b0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18b15b;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_2e0._M_nxt =
       (_Hash_node_base *)
       (pvVar9->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[4].column_._M_h._M_element_count;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001af6f8;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt = &local_300;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                local_2e0._M_nxt == (_Hash_node_base *)0x3);
  local_448._M_nxt._0_4_ = 3;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_390._M_nxt = (_Hash_node_base *)0x18b1dd;
  pcStack_388 = "";
  local_300._M_nxt = &local_2e0;
  local_370._M_nxt = &local_448;
  col3._0_8_ = &PTR__lazy_ostream_001af770;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_370;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  col2._0_8_ = col2._0_8_ & 0xffffffff00000000;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col2.column_._M_h,0,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col3,(key_equal *)&col4,(allocator_type *)&container_5);
  col2.operators_ = (Field_operators *)0x0;
  col2.entryPool_ = (Entry_constructor *)&settings;
  if (col2.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pCVar18 = &(local_440->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[5].column_;
    _Var14 = col2.column_._M_h._M_before_begin;
    do {
      uVar2 = *(undefined4 *)&(_Var14._M_nxt[1]._M_nxt)->_M_nxt;
      col4._0_8_ = operator_new(4);
      *(undefined4 *)col4._0_8_ = uVar2;
      col3._0_8_ = pCVar18;
      pVar21 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar18,&col4,&col3);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (col4._0_8_ != 0) {
          operator_delete((void *)col4._0_8_,4);
        }
        pvVar4 = *(void **)((long)pVar21.first.
                                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                  ._M_cur + 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,4);
        }
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar18->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar21.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  col3._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col3);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x3d8);
  pvVar9 = local_440;
  pUVar5 = (local_440->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if (pUVar5[5].column_._M_h._M_element_count != 0) {
      p_Var13 = pUVar5[5].column_._M_h._M_before_begin._M_nxt;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        p_Var6 = p_Var13->_M_nxt;
        for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          p_Var12 = p_Var6;
          if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
            p_Var12 = p_Var13;
          }
          p_Var13 = p_Var12;
        }
      }
      uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
      goto LAB_00154572;
    }
    col3.column_._M_h._M_bucket_count._0_4_ = 0;
    col3.column_._M_h._M_bucket_count._4_4_ = 0;
    col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col3.super_Column_dimension_option.dim_ = 0;
    col3._4_4_ = 0;
    col3.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col3.column_._M_h._M_element_count = 0;
  }
  else {
LAB_00154572:
    col4._0_8_ = col4._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col3,(long)(int)uVar15,(bool *)&col4,
               (allocator_type *)&local_390);
    for (p_Var13 = pUVar5[5].column_._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
        p_Var13 = p_Var13->_M_nxt) {
      uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar15) {
        puVar1 = (ulong *)(col3._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = col3.column_._M_h._M_bucket_count._4_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col3.column_._M_h._M_bucket_count;
  __last1_02.super__Bit_iterator_base._M_offset = col3.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col3.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col3.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col3.column_._M_h._M_bucket_count) - col3._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)col3._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar11 = false;
  }
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,bVar11);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_390._M_nxt = (_Hash_node_base *)0x18f732;
  pcStack_388 = "";
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001af7f0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_390;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  boost::test_tools::tt_detail::report_assertion(&container_5,&col4,&local_150,0x3d8,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  if (col3._0_8_ != 0) {
    operator_delete((void *)col3._0_8_,col3.column_._M_h._M_element_count - col3._0_8_);
    col3.super_Column_dimension_option.dim_ = 0;
    col3._4_4_ = 0;
    col3.column_._M_h._M_buckets =
         (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffff00000000);
    col3.column_._M_h._M_bucket_count._0_4_ = 0;
    col3.column_._M_h._M_bucket_count._4_4_ = 0;
    col3.column_._M_h._M_before_begin._M_nxt =
         col3.column_._M_h._M_before_begin._M_nxt & 0xffffffff00000000;
    col3.column_._M_h._M_element_count = 0;
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x3da);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_001af7b0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0x18b15b;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  local_448._M_nxt =
       (_Hash_node_base *)
       (pvVar9->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001af6f8;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b4120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_370;
  local_390._M_nxt._0_1_ = local_448._M_nxt == (_Hash_node_base *)0x5;
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_2e0._M_nxt = &local_2d0;
  local_2d0._M_nxt._0_4_ = 5;
  pcStack_388 = (char *)0x0;
  sStack_380.pi_ = (sp_counted_base *)0x0;
  col4._0_8_ = &PTR__lazy_ostream_001af770;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_2e0;
  local_300._M_nxt = (_Hash_node_base *)0x18b1dd;
  local_2f8 = "";
  local_370._M_nxt = &local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x300000002;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 6;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&container_5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,__l_01,
             (allocator_type *)&local_2e0);
  sVar16 = (long)col4.column_._M_h._M_buckets - col4._0_8_ >> 2;
  CVar17.dim_ = 0;
  if (col4.column_._M_h._M_buckets != (__buckets_ptr)col4._0_8_) {
    CVar17.dim_ = (int)sVar16 + -1;
  }
  pCVar18 = &col3.column_;
  col3.super_Column_dimension_option.dim_ = CVar17.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&pCVar18->_M_h,sVar16,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&local_390,(key_equal *)&local_300,(allocator_type *)&local_370);
  pp_Var10 = col4.column_._M_h._M_buckets;
  col3.operators_ = (Field_operators *)0x0;
  col3.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col4._0_8_ != col4.column_._M_h._M_buckets) {
    pp_Var19 = (__buckets_ptr)col4._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var19;
      local_300._M_nxt = (_Hash_node_base *)operator_new(4);
      *(undefined4 *)&(local_300._M_nxt)->_M_nxt = uVar2;
      local_390._M_nxt = (_Hash_node_base *)pCVar18;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pCVar18,&local_300,&local_390);
      pp_Var19 = (__buckets_ptr)((long)pp_Var19 + 4);
    } while (pp_Var19 != pp_Var10);
  }
  _Var14._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
  if (col4._0_8_ != 0) {
    operator_delete((void *)col4._0_8_,col4.column_._M_h._M_bucket_count - col4._0_8_);
    _Var14._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
  }
  col3.column_._M_h._M_before_begin._M_nxt = _Var14._M_nxt;
  if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
    pCVar18 = &(local_440->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[5].column_;
    do {
      uVar2 = *(undefined4 *)&(_Var14._M_nxt[1]._M_nxt)->_M_nxt;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)operator_new(4);
      *(undefined4 *)
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p = uVar2;
      col4._0_8_ = pCVar18;
      pVar21 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar18,&container_5,&col4);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,4);
        }
        pvVar4 = *(void **)((long)pVar21.first.
                                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                  ._M_cur + 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,4);
        }
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar18->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar21.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  col4._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col4);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x3e0);
  pvVar9 = local_440;
  pUVar5 = (local_440->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if (pUVar5[5].column_._M_h._M_element_count != 0) {
      p_Var13 = pUVar5[5].column_._M_h._M_before_begin._M_nxt;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        p_Var6 = p_Var13->_M_nxt;
        for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          p_Var12 = p_Var6;
          if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
            p_Var12 = p_Var13;
          }
          p_Var13 = p_Var12;
        }
      }
      uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
      goto LAB_00154b1a;
    }
    col4.column_._M_h._M_bucket_count = 0;
    col4.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._4_4_ = 0;
    col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col4.column_._M_h._M_element_count = 0;
  }
  else {
LAB_00154b1a:
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col4,(long)(int)uVar15,(bool *)&container_5,
               (allocator_type *)&local_300);
    for (p_Var13 = pUVar5[5].column_._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
        p_Var13 = p_Var13->_M_nxt) {
      uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar15) {
        puVar1 = (ulong *)(col4._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset = col4.column_._M_h._M_before_begin._M_nxt._0_4_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4.column_._M_h._M_bucket_count;
  if (((ulong)col4.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (col4.column_._M_h._M_bucket_count - col4._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar11 = false;
  }
  local_390._M_nxt._0_1_ = bVar11;
  pcStack_388 = (char *)0x0;
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_300._M_nxt = (_Hash_node_base *)0x18f732;
  local_2f8 = "";
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_001af7f0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_300;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion(&local_390,&container_5,&local_1a0,0x3e0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_380);
  if (col4._0_8_ != 0) {
    operator_delete((void *)col4._0_8_,col4.column_._M_h._M_element_count - col4._0_8_);
    col4.super_Column_dimension_option.dim_ = 0;
    col4._4_4_ = 0;
    col4.column_._M_h._M_buckets =
         (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffff00000000);
    col4.column_._M_h._M_bucket_count = 0;
    col4.column_._M_h._M_before_begin._M_nxt =
         col4.column_._M_h._M_before_begin._M_nxt & 0xffffffff00000000;
    col4.column_._M_h._M_element_count = 0;
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x3e2);
  pcStack_388 = (char *)((ulong)pcStack_388 & 0xffffffffffffff00);
  local_390._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001af7b0;
  sStack_380.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_378 = (_Hash_node_base *)0x18b15b;
  local_2d0._M_nxt =
       (_Hash_node_base *)
       (pvVar9->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001af6f8;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_2e0;
  local_300._M_nxt._0_1_ = local_2d0._M_nxt == (_Hash_node_base *)0x4;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  local_448._M_nxt = &local_270;
  local_270._M_nxt._0_4_ = 4;
  local_2f8 = (char *)0x0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_001af770;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_448;
  local_370._M_nxt = (_Hash_node_base *)0x18b1dd;
  local_368 = "";
  local_2e0._M_nxt = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  local_390._M_nxt = (_Hash_node_base *)0x100000000;
  pcStack_388 = (char *)0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_390;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container_5,__l_02,
             (allocator_type *)&local_448);
  sVar16 = container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ -
           (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p >> 2;
  CVar17.dim_ = 0;
  if ((_Bit_type *)
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ !=
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p) {
    CVar17.dim_ = (int)sVar16 + -1;
  }
  pCVar18 = &col4.column_;
  col4.super_Column_dimension_option.dim_ = CVar17.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&pCVar18->_M_h,sVar16,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&local_300,(key_equal *)&local_370,(allocator_type *)&local_2e0);
  uVar8 = container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_;
  col4.operators_ = (Field_operators *)0x0;
  col4.entryPool_ = (Entry_constructor *)&settings;
  if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      (_Bit_type *)
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_) {
    p_Var20 = container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      _Var7 = *p_Var20;
      local_370._M_nxt = (_Hash_node_base *)operator_new(4);
      *(int *)&(local_370._M_nxt)->_M_nxt = (int)_Var7;
      local_300._M_nxt = (_Hash_node_base *)pCVar18;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pCVar18,&local_370,&local_300);
      p_Var20 = (_Bit_type *)((long)p_Var20 + 4);
    } while (p_Var20 != (_Bit_type *)uVar8);
  }
  if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  pvVar9 = local_440;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,1);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((local_440->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)&container_5,&col4
            );
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,0x10001000101)
  ;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,1000);
  pUVar5 = (pvVar9->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar15 < 0) {
    if (pUVar5[3].column_._M_h._M_element_count == 0) {
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._12_4_ = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_00155088;
    }
    p_Var13 = pUVar5[3].column_._M_h._M_before_begin._M_nxt;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      p_Var6 = p_Var13->_M_nxt;
      for (; p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
        p_Var12 = p_Var6;
        if (*(uint *)&(p_Var6[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt) {
          p_Var12 = p_Var13;
        }
        p_Var13 = p_Var12;
      }
    }
    uVar15 = *(int *)&(p_Var13[1]._M_nxt)->_M_nxt + 1;
  }
  local_390._M_nxt = local_390._M_nxt & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&container_5,(long)(int)uVar15,(bool *)&local_390,(allocator_type *)&local_370);
  for (p_Var13 = pUVar5[3].column_._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
      p_Var13 = p_Var13->_M_nxt) {
    uVar3 = *(uint *)&(p_Var13[1]._M_nxt)->_M_nxt;
    if (uVar3 < uVar15) {
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] =
           container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
    }
  }
LAB_00155088:
  __last1_04.super__Bit_iterator_base._M_offset =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  __last1_04.super__Bit_iterator_base._M_p =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  if ((container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      ((long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_p -
      (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    bVar11 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                       (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar11 = false;
  }
  local_300._M_nxt._0_1_ = bVar11;
  local_2f8 = (char *)0x0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_370._M_nxt = (_Hash_node_base *)0x18f778;
  local_368 = "";
  pcStack_388 = (char *)((ulong)pcStack_388 & 0xffffffffffffff00);
  local_390._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001af7f0;
  sStack_380.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_378 = &local_370;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_300,&local_390,&local_1f0,1000,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3ea);
  local_2f8 = (char *)((ulong)local_2f8 & 0xffffffffffffff00);
  local_300._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001af7b0;
  sStack_2f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2e8 = "";
  local_270._M_nxt =
       (_Hash_node_base *)
       (pvVar9->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[3].column_._M_h._M_element_count;
  local_2d0._M_nxt = (_Hash_node_base *)local_264;
  local_370._M_nxt._0_1_ = local_270._M_nxt == (_Hash_node_base *)0x4;
  local_264 = (undefined1  [4])0x4;
  local_368 = (char *)0x0;
  sStack_360.pi_ = (sp_counted_base *)0x0;
  local_2e0._M_nxt = (_Hash_node_base *)0x18b1dd;
  local_2d8 = "";
  local_448._M_nxt = &local_270;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_001af6f8;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_448;
  pcStack_388 = (char *)((ulong)pcStack_388 & 0xffffffffffffff00);
  local_390._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001af770;
  sStack_380.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_378 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_360);
  for (_Var14 = col4.column_._M_h._M_before_begin; _Var14._M_nxt != (_Hash_node_base *)0x0;
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
    if (_Var14._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(_Var14._M_nxt[1]._M_nxt,4);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pCVar18->_M_h);
  for (_Var14._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
      _Var14._M_nxt != (_Hash_node_base *)0x0; _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
    if (_Var14._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(_Var14._M_nxt[1]._M_nxt,4);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col3.column_._M_h);
  for (_Var14._M_nxt = col2.column_._M_h._M_before_begin._M_nxt;
      _Var14._M_nxt != (_Hash_node_base *)0x0; _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
    if (_Var14._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(_Var14._M_nxt[1]._M_nxt,4);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col2.column_._M_h);
  for (_Var14._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
      _Var14._M_nxt != (_Hash_node_base *)0x0; _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
    if (_Var14._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(_Var14._M_nxt[1]._M_nxt,4);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col1.column_._M_h);
  for (; col0.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col0.column_._M_h._M_before_begin._M_nxt = (col0.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    if (col0.column_._M_h._M_before_begin._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(col0.column_._M_h._M_before_begin._M_nxt[1]._M_nxt,4);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col0.column_._M_h);
  if (veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}